

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void aom_get_var_sse_sum_16x16_dual_c
               (uint8_t *src_ptr,int source_stride,uint8_t *ref_ptr,int ref_stride,
               uint32_t *sse16x16,uint *tot_sse,int *tot_sum,uint32_t *var16x16)

{
  int i;
  long lVar1;
  int sum16x16 [2];
  
  sum16x16[0] = 0;
  sum16x16[1] = 0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 4) {
    variance(src_ptr,source_stride,ref_ptr,ref_stride,0x10,0x10,(uint32_t *)((long)sse16x16 + lVar1)
             ,(int *)((long)sum16x16 + lVar1));
    ref_ptr = ref_ptr + 0x10;
    src_ptr = src_ptr + 0x10;
  }
  *tot_sse = *tot_sse + sse16x16[1] + *sse16x16;
  *tot_sum = *tot_sum + sum16x16[1] + sum16x16[0];
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    var16x16[lVar1] =
         sse16x16[lVar1] - (int)((ulong)((long)sum16x16[lVar1] * (long)sum16x16[lVar1]) >> 8);
  }
  return;
}

Assistant:

void aom_get_var_sse_sum_16x16_dual_c(const uint8_t *src_ptr, int source_stride,
                                      const uint8_t *ref_ptr, int ref_stride,
                                      uint32_t *sse16x16, unsigned int *tot_sse,
                                      int *tot_sum, uint32_t *var16x16) {
  int sum16x16[2] = { 0 };
  // Loop over two consecutive 16x16 blocks and process as one 16x32 block.
  for (int k = 0; k < 2; k++) {
    variance(src_ptr + (k * 16), source_stride, ref_ptr + (k * 16), ref_stride,
             16, 16, &sse16x16[k], &sum16x16[k]);
  }

  // Calculate variance at 16x16 level and total sse, sum of 16x32 block.
  *tot_sse += sse16x16[0] + sse16x16[1];
  *tot_sum += sum16x16[0] + sum16x16[1];
  for (int i = 0; i < 2; i++)
    var16x16[i] =
        sse16x16[i] - (uint32_t)(((int64_t)sum16x16[i] * sum16x16[i]) >> 8);
}